

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

bool isVariableIndexable(DWARFDie *Die,DWARFContext *DCtx)

{
  bool bVar1;
  DWARFFormValue *pDVar2;
  ArrayRef<unsigned_char> *pAVar3;
  DWARFDebugLoc *this;
  unsigned_long *puVar4;
  LocationList *pLVar5;
  Optional<unsigned_long> OVar6;
  LocationList *LocList;
  DWARFDebugLoc *DebugLoc;
  Optional<unsigned_long> Offset;
  undefined1 local_98 [8];
  Optional<llvm::ArrayRef<unsigned_char>_> Expr;
  anon_class_16_2_209e955a ContainsInterestingOperators;
  ArrayRef<llvm::dwarf::Attribute> local_68;
  undefined1 local_58 [8];
  Optional<llvm::DWARFFormValue> Location;
  DWARFContext *DCtx_local;
  DWARFDie *Die_local;
  
  ContainsInterestingOperators.DCtx._6_2_ = 2;
  Location.Storage._48_8_ = DCtx;
  llvm::ArrayRef<llvm::dwarf::Attribute>::ArrayRef
            (&local_68,(Attribute *)((long)&ContainsInterestingOperators.DCtx + 6));
  llvm::DWARFDie::findRecursively((Optional<llvm::DWARFFormValue> *)local_58,Die,local_68);
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)local_58);
  if (bVar1) {
    ContainsInterestingOperators.Die = (DWARFDie *)Location.Storage._48_8_;
    Expr.Storage._16_8_ = Die;
    pDVar2 = llvm::Optional<llvm::DWARFFormValue>::operator->
                       ((Optional<llvm::DWARFFormValue> *)local_58);
    llvm::DWARFFormValue::getAsBlock((Optional<llvm::ArrayRef<unsigned_char>_> *)local_98,pDVar2);
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)local_98);
    if (bVar1) {
      pAVar3 = llvm::Optional<llvm::ArrayRef<unsigned_char>_>::operator*
                         ((Optional<llvm::ArrayRef<unsigned_char>_> *)local_98);
      Offset.Storage._8_8_ = pAVar3->Data;
      bVar1 = isVariableIndexable::anon_class_16_2_209e955a::operator()
                        ((anon_class_16_2_209e955a *)&Expr.Storage.hasVal,*pAVar3);
      if (bVar1) {
        return true;
      }
    }
    else {
      pDVar2 = llvm::Optional<llvm::DWARFFormValue>::operator->
                         ((Optional<llvm::DWARFFormValue> *)local_58);
      OVar6 = llvm::DWARFFormValue::getAsSectionOffset(pDVar2);
      DebugLoc = (DWARFDebugLoc *)OVar6.Storage.field_0;
      Offset.Storage.field_0.empty = OVar6.Storage.hasVal;
      bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&DebugLoc);
      if ((bVar1) &&
         (this = llvm::DWARFContext::getDebugLoc((DWARFContext *)Location.Storage._48_8_),
         this != (DWARFDebugLoc *)0x0)) {
        puVar4 = llvm::Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&DebugLoc);
        pLVar5 = llvm::DWARFDebugLoc::getLocationListAtOffset(this,*puVar4);
        if ((pLVar5 != (LocationList *)0x0) &&
           (bVar1 = llvm::
                    any_of<llvm::SmallVector<llvm::DWARFDebugLoc::Entry,2u>const&,isVariableIndexable(llvm::DWARFDie_const&,llvm::DWARFContext&)::__1>
                              (&pLVar5->Entries,
                               (anon_class_8_1_7da2a394_for__M_pred)&Expr.Storage.hasVal), bVar1)) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static bool isVariableIndexable(const DWARFDie &Die, DWARFContext &DCtx) {
  Optional<DWARFFormValue> Location = Die.findRecursively(DW_AT_location);
  if (!Location)
    return false;

  auto ContainsInterestingOperators = [&](ArrayRef<uint8_t> D) {
    DWARFUnit *U = Die.getDwarfUnit();
    DataExtractor Data(toStringRef(D), DCtx.isLittleEndian(), U->getAddressByteSize());
    DWARFExpression Expression(Data, U->getVersion(), U->getAddressByteSize());
    return any_of(Expression, [](DWARFExpression::Operation &Op) {
      return !Op.isError() && (Op.getCode() == DW_OP_addr ||
                               Op.getCode() == DW_OP_form_tls_address ||
                               Op.getCode() == DW_OP_GNU_push_tls_address);
    });
  };

  if (Optional<ArrayRef<uint8_t>> Expr = Location->getAsBlock()) {
    // Inlined location.
    if (ContainsInterestingOperators(*Expr))
      return true;
  } else if (Optional<uint64_t> Offset = Location->getAsSectionOffset()) {
    // Location list.
    if (const DWARFDebugLoc *DebugLoc = DCtx.getDebugLoc()) {
      if (const DWARFDebugLoc::LocationList *LocList =
              DebugLoc->getLocationListAtOffset(*Offset)) {
        if (any_of(LocList->Entries, [&](const DWARFDebugLoc::Entry &E) {
              return ContainsInterestingOperators(E.Loc);
            }))
          return true;
      }
    }
  }
  return false;
}